

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

shared_ptr<fasttext::Matrix> __thiscall
fasttext::FastText::getInputMatrixFromFile(FastText *this,string *filename)

{
  pointer pcVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  char cVar4;
  int32_t iVar5;
  uint uVar6;
  istream *piVar7;
  invalid_argument *piVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  size_t j;
  ulong uVar9;
  ulong uVar10;
  EVP_PKEY_CTX *ctx;
  long lVar11;
  long lVar12;
  size_t i;
  shared_ptr<fasttext::Matrix> sVar13;
  string_view w;
  int64_t dim;
  shared_ptr<fasttext::DenseMatrix> input;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  int64_t n;
  shared_ptr<fasttext::DenseMatrix> mat;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  string local_2b8;
  string local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ifstream in;
  
  std::ifstream::ifstream(&in,(string *)in_RDX,_S_in);
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  mat.super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  mat.super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 == '\0') {
    piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&input,
                   in_RDX," cannot be opened for loading!");
    std::invalid_argument::invalid_argument(piVar8,(string *)&input);
    __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar7 = std::istream::_M_extract<long>((long *)&in);
  std::istream::_M_extract<long>((long *)piVar7);
  if (dim == *(int *)((filename->_M_dataplus)._M_p + 0x84)) {
    std::make_shared<fasttext::DenseMatrix,long&,long&>((long *)&input,&n);
    std::__shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&mat.super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2> *)&input);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&input.super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    for (uVar10 = 0; uVar10 < (ulong)n; uVar10 = uVar10 + 1) {
      input.super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&local_338;
      input.super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_338._M_local_buf[0] = '\0';
      std::operator>>((istream *)&in,(string *)&input);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&words,(value_type *)&input);
      Dictionary::add((Dictionary *)(filename->field_2)._M_allocated_capacity,(value_type *)&input);
      for (uVar9 = 0; uVar9 < (ulong)dim; uVar9 = uVar9 + 1) {
        std::istream::_M_extract<float>((float *)&in);
      }
      std::__cxx11::string::~string((string *)&input);
    }
    std::ifstream::close();
    ctx = (EVP_PKEY_CTX *)0x1;
    Dictionary::threshold((Dictionary *)(filename->field_2)._M_allocated_capacity,1,0);
    Dictionary::init((Dictionary *)(filename->field_2)._M_allocated_capacity,ctx);
    iVar5 = Dictionary::nwords((Dictionary *)(filename->field_2)._M_allocated_capacity);
    local_2d8._M_dataplus._M_p._0_4_ = iVar5 + *(int *)((filename->_M_dataplus)._M_p + 0xa8);
    std::make_shared<fasttext::DenseMatrix,int,int&>((int *)&input,(int *)&local_2d8);
    pcVar1 = (filename->_M_dataplus)._M_p;
    DenseMatrix::uniform
              (input.super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               1.0 / (float)*(int *)(pcVar1 + 0x84),*(uint *)(pcVar1 + 0xb4),
               *(int32_t *)(pcVar1 + 0x10c));
    lVar12 = 0;
    for (uVar10 = 0;
        _Var3._M_pi = input.super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi,
        peVar2 = input.super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
        uVar10 < (ulong)n; uVar10 = uVar10 + 1) {
      w._M_str = words.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_dataplus._M_p;
      w._M_len = words.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_string_length;
      uVar6 = Dictionary::getId((Dictionary *)(filename->field_2)._M_allocated_capacity,w);
      if (-1 < (int)uVar6) {
        iVar5 = Dictionary::nwords((Dictionary *)(filename->field_2)._M_allocated_capacity);
        if ((int)uVar6 < iVar5) {
          for (lVar11 = 0; dim != lVar11; lVar11 = lVar11 + 1) {
            ((input.super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            data_).mem_
            [((input.super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             super_Matrix).n_ * (ulong)uVar6 + lVar11] =
                 *(float *)((long)((mat.
                                    super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->data_).mem_ +
                           lVar11 * 4 +
                           ((mat.
                             super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->super_Matrix).n_ * lVar12);
          }
        }
      }
      lVar12 = lVar12 + 4;
    }
    input.super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    input.super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)peVar2;
    (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var3._M_pi;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&input.super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&mat.super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&words);
    std::ifstream::~ifstream(&in);
    sVar13.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar13.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<fasttext::Matrix>)
           sVar13.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>;
  }
  piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_298,dim);
  std::operator+(&local_278,"Dimension of pretrained vectors (",&local_298);
  std::operator+(&local_258,&local_278,") does not match dimension (");
  std::__cxx11::to_string(&local_2b8,*(int *)((filename->_M_dataplus)._M_p + 0x84));
  std::operator+(&local_2d8,&local_258,&local_2b8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&input,
                 &local_2d8,")!");
  std::invalid_argument::invalid_argument(piVar8,(string *)&input);
  __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::shared_ptr<Matrix> FastText::getInputMatrixFromFile(
    const std::string& filename) const {
  std::ifstream in(filename);
  std::vector<std::string> words;
  std::shared_ptr<DenseMatrix> mat; // temp. matrix for pretrained vectors
  int64_t n, dim;
  if (!in.is_open()) {
    throw std::invalid_argument(filename + " cannot be opened for loading!");
  }
  in >> n >> dim;
  if (dim != args_->dim) {
    throw std::invalid_argument(
        "Dimension of pretrained vectors (" + std::to_string(dim) +
        ") does not match dimension (" + std::to_string(args_->dim) + ")!");
  }
  mat = std::make_shared<DenseMatrix>(n, dim);
  for (size_t i = 0; i < n; i++) {
    std::string word;
    in >> word;
    words.push_back(word);
    dict_->add(word);
    for (size_t j = 0; j < dim; j++) {
      in >> mat->at(i, j);
    }
  }
  in.close();

  dict_->threshold(1, 0);
  dict_->init();
  std::shared_ptr<DenseMatrix> input = std::make_shared<DenseMatrix>(
      dict_->nwords() + args_->bucket, args_->dim);
  input->uniform(1.0 / args_->dim, args_->thread, args_->seed);

  for (size_t i = 0; i < n; i++) {
    int32_t idx = dict_->getId(words[i]);
    if (idx < 0 || idx >= dict_->nwords()) {
      continue;
    }
    for (size_t j = 0; j < dim; j++) {
      input->at(idx, j) = mat->at(i, j);
    }
  }
  return input;
}